

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_kv_test.cc
# Opt level: O1

void kv_cmp_key_str_test(btree_kv_ops *kv_ops,int i)

{
  char *__s;
  long *plVar1;
  btree_cmp_func *pbVar2;
  code *pcVar3;
  int iVar4;
  btree_kv_ops *pbVar5;
  long *plVar6;
  long lVar7;
  char *pcVar8;
  __suseconds_t *p_Var9;
  ulong uVar10;
  long alStack_b8 [10];
  undefined1 local_68 [8];
  timeval __test_begin;
  void *local_50;
  __suseconds_t local_30;
  void *tmp;
  
  pbVar5 = (btree_kv_ops *)0x0;
  gettimeofday((timeval *)local_68,(__timezone_ptr_t)0x0);
  memleak_start();
  if (i == 0) {
    pbVar5 = btree_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  }
  if (i == 1) {
    pbVar5 = btree_kv_get_kb32_vb64((btree_kv_ops *)0x0);
  }
  local_30 = 0;
  uVar10 = 0;
  __s = local_68;
  do {
    pcVar8 = __s;
    __s = pcVar8 + -0x10;
    (&__test_begin.tv_usec)[uVar10] = (__suseconds_t)__s;
    pcVar8[-0x18] = -0x60;
    pcVar8[-0x17] = '?';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    sprintf(__s,"key%d",uVar10 & 0xffffffff);
    uVar10 = uVar10 + 1;
  } while (uVar10 != 4);
  pbVar2 = kv_ops->cmp;
  pcVar8[-0x18] = -0x4a;
  pcVar8[-0x17] = '?';
  pcVar8[-0x16] = '\x10';
  pcVar8[-0x15] = '\0';
  pcVar8[-0x14] = '\0';
  pcVar8[-0x13] = '\0';
  pcVar8[-0x12] = '\0';
  pcVar8[-0x11] = '\0';
  p_Var9 = (__suseconds_t *)__test_begin.tv_usec;
  iVar4 = (*pbVar2)((void *)__test_begin.tv_usec,(void *)__test_begin.tv_usec,(void *)0x0);
  if (iVar4 == 0) {
    pbVar2 = pbVar5->cmp;
    pcVar8[-0x18] = -0x36;
    pcVar8[-0x17] = '?';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    p_Var9 = (__suseconds_t *)__test_begin.tv_usec;
    iVar4 = (*pbVar2)((void *)__test_begin.tv_usec,(void *)__test_begin.tv_usec,(void *)0x0);
    if (iVar4 != 0) goto LAB_0010408a;
    pbVar2 = kv_ops->cmp;
    pcVar8[-0x18] = -0x20;
    pcVar8[-0x17] = '?';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    p_Var9 = (__suseconds_t *)__test_begin.tv_usec;
    iVar4 = (*pbVar2)((void *)__test_begin.tv_usec,local_50,(void *)0x0);
    if (iVar4 == 0) goto LAB_0010408f;
    pbVar2 = pbVar5->cmp;
    pcVar8[-0x18] = -0xb;
    pcVar8[-0x17] = '?';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    p_Var9 = (__suseconds_t *)__test_begin.tv_usec;
    iVar4 = (*pbVar2)((void *)__test_begin.tv_usec,local_50,(void *)0x0);
    if (iVar4 == 0) goto LAB_00104094;
    p_Var9 = &local_30;
    pbVar2 = kv_ops->cmp;
    builtin_strncpy(pcVar8 + -0x18,"\v@\x10",4);
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    iVar4 = (*pbVar2)(p_Var9,(void *)__test_begin.tv_usec,(void *)0x0);
    if (iVar4 == 0) goto LAB_00104099;
    p_Var9 = &local_30;
    pbVar2 = pbVar5->cmp;
    builtin_strncpy(pcVar8 + -0x18," @\x10",4);
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    iVar4 = (*pbVar2)(p_Var9,(void *)__test_begin.tv_usec,(void *)0x0);
    if (iVar4 == 0) goto LAB_0010409e;
    p_Var9 = &__test_begin.tv_usec;
    pbVar2 = kv_ops->cmp;
    builtin_strncpy(pcVar8 + -0x18,"2@\x10",4);
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    iVar4 = (*pbVar2)(p_Var9,&local_30,(void *)0x0);
    if (iVar4 == 0) goto LAB_001040a3;
    p_Var9 = &__test_begin.tv_usec;
    pbVar2 = pbVar5->cmp;
    builtin_strncpy(pcVar8 + -0x18,"C@\x10",4);
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    iVar4 = (*pbVar2)(p_Var9,&local_30,(void *)0x0);
    if (iVar4 == 0) goto LAB_001040a8;
    p_Var9 = &local_30;
    pbVar2 = kv_ops->cmp;
    builtin_strncpy(pcVar8 + -0x18,"T@\x10",4);
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    iVar4 = (*pbVar2)(p_Var9,p_Var9,(void *)0x0);
    if (iVar4 == 0) {
      p_Var9 = &local_30;
      pbVar2 = pbVar5->cmp;
      builtin_strncpy(pcVar8 + -0x18,"d@\x10",4);
      pcVar8[-0x14] = '\0';
      pcVar8[-0x13] = '\0';
      pcVar8[-0x12] = '\0';
      pcVar8[-0x11] = '\0';
      iVar4 = (*pbVar2)(p_Var9,p_Var9,(void *)0x0);
      if (iVar4 == 0) {
        builtin_strncpy(pcVar8 + -0x18,"x@\x10",4);
        pcVar8[-0x14] = '\0';
        pcVar8[-0x13] = '\0';
        pcVar8[-0x12] = '\0';
        pcVar8[-0x11] = '\0';
        kv_cmp_key_str_test();
        return;
      }
      goto LAB_001040b2;
    }
  }
  else {
    pcVar8[-0x18] = -0x76;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_0010408a:
    pcVar8[-0x18] = -0x71;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_0010408f:
    pcVar8[-0x18] = -0x6c;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_00104094:
    pcVar8[-0x18] = -0x67;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_00104099:
    pcVar8[-0x18] = -0x62;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_0010409e:
    pcVar8[-0x18] = -0x5d;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_001040a3:
    pcVar8[-0x18] = -0x58;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
LAB_001040a8:
    pcVar8[-0x18] = -0x53;
    pcVar8[-0x17] = '@';
    pcVar8[-0x16] = '\x10';
    pcVar8[-0x15] = '\0';
    pcVar8[-0x14] = '\0';
    pcVar8[-0x13] = '\0';
    pcVar8[-0x12] = '\0';
    pcVar8[-0x11] = '\0';
    kv_cmp_key_str_test();
  }
  pcVar8[-0x18] = -0x4e;
  pcVar8[-0x17] = '@';
  pcVar8[-0x16] = '\x10';
  pcVar8[-0x15] = '\0';
  pcVar8[-0x14] = '\0';
  pcVar8[-0x13] = '\0';
  pcVar8[-0x12] = '\0';
  pcVar8[-0x11] = '\0';
  kv_cmp_key_str_test();
LAB_001040b2:
  *(code **)(pcVar8 + -0x18) = kv_bid_to_value_to_bid_test;
  kv_cmp_key_str_test();
  *(char **)(pcVar8 + -0x18) = "key%d";
  *(btree_kv_ops **)(pcVar8 + -0x20) = kv_ops;
  *(btree_kv_ops **)(pcVar8 + -0x28) = pbVar5;
  pcVar8[-0x50] = -0x31;
  pcVar8[-0x4f] = '@';
  pcVar8[-0x4e] = '\x10';
  pcVar8[-0x4d] = '\0';
  pcVar8[-0x4c] = '\0';
  pcVar8[-0x4b] = '\0';
  pcVar8[-0x4a] = '\0';
  pcVar8[-0x49] = '\0';
  gettimeofday((timeval *)(pcVar8 + -0x38),(__timezone_ptr_t)0x0);
  pcVar8[-0x50] = -0x2c;
  pcVar8[-0x4f] = '@';
  pcVar8[-0x4e] = '\x10';
  pcVar8[-0x4d] = '\0';
  pcVar8[-0x4c] = '\0';
  pcVar8[-0x4b] = '\0';
  pcVar8[-0x4a] = '\0';
  pcVar8[-0x49] = '\0';
  memleak_start();
  plVar1 = (long *)(pcVar8 + -0x40);
  *plVar1 = 10;
  pcVar3 = (code *)p_Var9[0xe];
  pcVar8[-0x50] = -0x1a;
  pcVar8[-0x4f] = '@';
  pcVar8[-0x4e] = '\x10';
  pcVar8[-0x4d] = '\0';
  pcVar8[-0x4c] = '\0';
  pcVar8[-0x4b] = '\0';
  pcVar8[-0x4a] = '\0';
  pcVar8[-0x49] = '\0';
  plVar6 = (long *)(*pcVar3)(plVar1);
  if (*plVar6 != *plVar1) {
    pcVar8[-0x50] = -2;
    pcVar8[-0x4f] = '@';
    pcVar8[-0x4e] = '\x10';
    pcVar8[-0x4d] = '\0';
    pcVar8[-0x4c] = '\0';
    pcVar8[-0x4b] = '\0';
    pcVar8[-0x4a] = '\0';
    pcVar8[-0x49] = '\0';
    kv_bid_to_value_to_bid_test();
  }
  pcVar3 = (code *)p_Var9[0xd];
  builtin_strncpy(pcVar8 + -0x50,"\x04A\x10",4);
  pcVar8[-0x4c] = '\0';
  pcVar8[-0x4b] = '\0';
  pcVar8[-0x4a] = '\0';
  pcVar8[-0x49] = '\0';
  lVar7 = (*pcVar3)(plVar6);
  if (lVar7 != *(long *)(pcVar8 + -0x40)) {
    builtin_strncpy(pcVar8 + -0x50,"\x18A\x10",4);
    pcVar8[-0x4c] = '\0';
    pcVar8[-0x4b] = '\0';
    pcVar8[-0x4a] = '\0';
    pcVar8[-0x49] = '\0';
    kv_bid_to_value_to_bid_test();
  }
  builtin_strncpy(pcVar8 + -0x50,"\'A\x10",4);
  pcVar8[-0x4c] = '\0';
  pcVar8[-0x4b] = '\0';
  pcVar8[-0x4a] = '\0';
  pcVar8[-0x49] = '\0';
  kv_bid_to_value_to_bid_test();
  return;
}

Assistant:

void kv_cmp_key_str_test(btree_kv_ops *kv_ops, int i)
{

    TEST_INIT();
    memleak_start();

    idx_t idx;
    int cmp;
    int n = 4;
    char **keys = alca(char*, n);
    void *tmp;
    btree_kv_ops *kv_ops2 = NULL;

    if (i == 0){
        kv_ops2 = btree_kv_get_kb64_vb64(NULL);
    }
    if (i == 1){
        kv_ops2 =  btree_kv_get_kb32_vb64(NULL);

    }

    tmp = NULL;

    for (idx = 0; idx < n; idx ++){
        keys[idx] = alca(char, 8);
        sprintf(keys[idx], "key%d", idx);
    }

    // compare strings equal length equal values
    cmp = kv_ops->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(keys[0], keys[0], NULL);
    TEST_CHK( cmp == 0 );

    // compare strings equal length diff values
    cmp = kv_ops->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(keys[0], keys[1], NULL);
    TEST_CHK( cmp != 0 );

    // key1 is NULL
    cmp = kv_ops->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&tmp, keys[0], NULL);
    TEST_CHK( cmp != 0 );

    // key2 is NULL
    cmp = kv_ops->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );
    cmp = kv_ops2->cmp(&keys[0], &tmp, NULL);
    TEST_CHK( cmp != 0 );

    // key1 and key2 are NULL
    cmp = kv_ops->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );
    cmp = kv_ops2->cmp(&tmp, &tmp, NULL);
    TEST_CHK( cmp == 0 );

    free(kv_ops2);
    memleak_end();
    TEST_RESULT("kv_cmp_key_str_test");
}